

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O1

Group * __thiscall ezc3d::ParametersNS::Parameters::group(Parameters *this,size_t idx)

{
  pointer pGVar1;
  out_of_range *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  ulong uVar5;
  undefined1 auVar6 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pGVar1 = (this->_groups).
           super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->_groups).
                 super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 5) *
          -0x5555555555555555;
  if (idx <= uVar5 && uVar5 - idx != 0) {
    return pGVar1 + idx;
  }
  auVar6 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      idx);
  if (auVar6._8_4_ == 1) {
    __cxa_begin_catch(auVar6._0_8_);
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_90,idx);
    std::operator+(&local_70,"Parameters::group method is trying to access the group ",&local_90);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_f0._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_f0._M_dataplus._M_p == psVar3) {
      local_f0.field_2._M_allocated_capacity = *psVar3;
      local_f0.field_2._8_8_ = plVar2[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar3;
    }
    local_f0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string
              (&local_b0,
               ((long)(this->_groups).
                      super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_groups).
                      super__Vector_base<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
    std::operator+(&local_50,&local_f0,&local_b0);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d0 = (long *)*plVar2;
    plVar4 = plVar2 + 2;
    if (local_d0 == plVar4) {
      local_c0 = *plVar4;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar4;
    }
    local_c8 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::out_of_range::out_of_range(this_00,(string *)&local_d0);
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  _Unwind_Resume(auVar6._0_8_);
}

Assistant:

ezc3d::ParametersNS::GroupNS::Group &
ezc3d::ParametersNS::Parameters::group(size_t idx) {
  try {
    return _groups.at(idx);
  } catch (const std::out_of_range&) {
    throw std::out_of_range(
        "Parameters::group method is trying to access the group " +
        std::to_string(idx) + " while the maximum number of groups is " +
        std::to_string(nbGroups()) + ".");
  }
}